

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

int main(int argc,char **argv)

{
  list_node_t *plVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  list_node_t *plVar6;
  anm_archive_t *paVar7;
  void *pvVar8;
  FILE *pFVar9;
  int *piVar10;
  char *pcVar11;
  list_node_t *plVar12;
  anm_entry_t *paVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  list_node_t *plVar18;
  list_node_t *plVar19;
  list_node_t *plVar20;
  long *plVar21;
  ulong uVar22;
  long lVar23;
  int ind;
  anm_entry_t *tmp;
  char commands [21];
  uint local_88;
  FILE *local_80;
  uint local_6c;
  char *local_68;
  list_node_t local_60;
  char local_48 [24];
  
  g_anmmap = anmmap_new();
  atexit(free_globals);
  builtin_strncpy(local_48,":l:om:x:X:r:c:s:Vfuv",0x15);
  argv0 = util_shortname(*argv);
  local_6c = 0;
  iVar4 = -1;
  if (argv[util_optind] == (char *)0x0) {
    local_88 = 0;
    local_80 = (FILE *)0x0;
  }
  else {
    local_80 = (FILE *)0x0;
    local_88 = 0;
    iVar4 = -1;
    do {
      iVar3 = util_getopt(argc,argv,local_48);
      switch(iVar3) {
      case 99:
        if (option_print_offsets == 0) goto switchD_0010ce78_caseD_6c;
LAB_0010d222:
        pcVar16 = "%s: \'o\' option can\'t be used when creating ANM archive\n";
        goto LAB_0010ce23;
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x74:
      case 0x77:
switchD_0010ce78_caseD_64:
        util_getopt_default((int *)&local_6c,argv,iVar3,print_usage);
        break;
      case 0x66:
        option_force = 1;
        break;
      case 0x6c:
      case 0x72:
      case 0x78:
        goto switchD_0010ce78_caseD_6c;
      case 0x6d:
        pFVar9 = fopen(util_optarg,"r");
        pFVar5 = _stderr;
        if (pFVar9 == (FILE *)0x0) {
          local_68 = argv0;
          local_60.data = util_optarg;
          piVar10 = __errno_location();
          strerror(*piVar10);
          fprintf(pFVar5,"%s: couldn\'t open %s for reading: %s\n",local_68,local_60.data);
        }
        else {
          anmmap_load(g_anmmap,(FILE *)pFVar9,util_optarg);
          fclose(pFVar9);
        }
        break;
      case 0x6f:
        if (iVar4 == 99) goto LAB_0010d222;
        option_print_offsets = 1;
        break;
      case 0x73:
        local_80 = fopen(util_optarg,"w");
        pFVar5 = _stderr;
        pcVar16 = argv0;
        if (local_80 == (FILE *)0x0) {
          local_68 = util_optarg;
          piVar10 = __errno_location();
          strerror(*piVar10);
          fprintf(pFVar5,"%s: couldn\'t open %s for writing: %s\n",pcVar16,local_68);
          local_80 = (FILE *)0x0;
        }
        break;
      case 0x75:
        if (option_unique_filenames == 0) {
          option_unique_filenames = 1;
        }
        else {
          option_dont_add_offset_border = 1;
        }
        break;
      case 0x76:
        option_verbose = option_verbose + 1;
        break;
      default:
        if (iVar3 != 0x58) goto switchD_0010ce78_caseD_64;
switchD_0010ce78_caseD_6c:
        if (iVar4 != -1) {
          fprintf(_stderr,"%s: More than one mode specified\n",argv0);
          goto LAB_0010d153;
        }
        local_88 = parse_version(util_optarg);
        iVar4 = iVar3;
      }
    } while (argv[util_optind] != (char *)0x0);
  }
  uVar2 = local_6c;
  lVar15 = (long)(int)local_6c;
  argv[lVar15] = (char *)0x0;
  if (iVar4 == -1) goto LAB_0010d153;
  if ((int)local_88 < 6) {
    if (local_88 != 0) goto LAB_0010d096;
    pcVar16 = "%s: version must be specified\n";
LAB_0010ce23:
    fprintf(_stderr,pcVar16,argv0);
    goto LAB_0010d0b8;
  }
  if ((int)local_88 < 0x5f) {
    if (local_88 - 6 < 0xe) {
LAB_0010d0c2:
      if (iVar4 < 0x6c) {
        if (iVar4 == 0x58) {
          list_init((list_t *)&local_60);
          if (0 < (int)uVar2) {
            lVar23 = 0;
            plVar6 = &local_60;
            do {
              current_input = argv[lVar23];
              pFVar5 = fopen(argv[lVar23],"rb");
              if (pFVar5 == (FILE *)0x0) goto LAB_0010d572;
              paVar7 = anm_read_file((FILE *)pFVar5,local_88);
              list_append_new((list_t *)plVar6,paVar7);
              fclose(pFVar5);
              lVar23 = lVar23 + 1;
            } while (lVar15 != lVar23);
            anm_build_name_lists_multiple((list_t *)plVar6);
            lVar15 = 0;
            while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
              plVar21 = (long *)((long)plVar6->data + 0x20);
              iVar4 = 0;
              while (plVar21 = (long *)*plVar21, plVar21 != (long *)0x0) {
                paVar13 = (anm_entry_t *)plVar21[2];
                if (paVar13->processed == 0) {
                  current_output = paVar13->name;
                  if (option_verbose != 0) {
                    fprintf(_stderr,"%s\n");
                  }
                  if (option_unique_filenames == 0) {
                    pcVar16 = (char *)0x0;
                  }
                  else {
                    pcVar16 = anm_make_unique_filename(paVar13->name,argv[lVar15],iVar4);
                  }
                  pcVar17 = pcVar16;
                  if (pcVar16 == (char *)0x0) {
                    pcVar17 = paVar13->name;
                  }
                  anm_extract(paVar13,pcVar17,local_88);
                  free(pcVar16);
                }
                iVar4 = iVar4 + 1;
              }
              lVar15 = lVar15 + 1;
            }
            plVar6 = &local_60;
            while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
              anm_free((anm_archive_t *)plVar6->data);
            }
            list_free_nodes((list_t *)&local_60);
            goto LAB_0010d87c;
          }
        }
        else if ((iVar4 == 99) && (local_6c == 2)) {
          current_input = argv[1];
          paVar7 = anm_create(current_input,(FILE *)local_80,local_88);
          if (local_80 != (FILE *)0x0) {
            fclose(local_80);
          }
          if (paVar7 == (anm_archive_t *)0x0) goto LAB_0010d87c;
          anm_defaults(paVar7,local_88);
          if (option_unique_filenames == 0) {
            plVar6 = (list_node_t *)&paVar7->names;
            while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
              pvVar8 = plVar6->data;
              plVar12 = (list_node_t *)&paVar7->entries;
              plVar20 = &local_60;
              while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
                plVar18 = (list_node_t *)plVar12->data;
                if (plVar18->data == pvVar8) {
                  plVar20->next = plVar18;
                  plVar20 = (list_node_t *)&plVar18[1].data;
                }
              }
            }
          }
          plVar12 = (list_node_t *)&paVar7->entries;
          plVar6 = plVar12;
          while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
            plVar21 = (long *)plVar6->data;
            if ((*(short *)(*plVar21 + 0x34) != 0) && (plVar21[0xb] == 0)) {
              pvVar8 = calloc(1,(ulong)*(uint *)(plVar21[1] + 0xc));
              plVar21[0xb] = (long)pvVar8;
            }
          }
          while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
            paVar13 = (anm_entry_t *)plVar12->data;
            if (paVar13->processed == 0) {
              pcVar16 = paVar13->filename;
              if (pcVar16 == (char *)0x0) {
                pcVar16 = paVar13->name;
              }
              anm_replace(paVar7,(FILE *)0x0,paVar13,pcVar16,local_88);
            }
          }
          current_output = *argv;
          anm_write(paVar7,*argv,local_88);
LAB_0010d877:
          anm_free(paVar7);
LAB_0010d87c:
          exit(0);
        }
      }
      else if (iVar4 == 0x78) {
        if (0 < (int)local_6c) {
          current_input = *argv;
          pFVar5 = fopen(*argv,"rb");
          if (pFVar5 != (FILE *)0x0) {
            paVar7 = anm_read_file((FILE *)pFVar5,local_88);
            fclose(pFVar5);
            if (option_unique_filenames == 0) {
              plVar6 = (list_node_t *)&paVar7->names;
              while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
                pvVar8 = plVar6->data;
                plVar12 = (list_node_t *)&paVar7->entries;
                plVar20 = &local_60;
                while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
                  plVar18 = (list_node_t *)plVar12->data;
                  if (plVar18->data == pvVar8) {
                    plVar20->next = plVar18;
                    plVar20 = (list_node_t *)&plVar18[1].data;
                  }
                }
              }
            }
            plVar6 = (list_node_t *)&paVar7->entries;
            if (uVar2 == 1) {
              iVar4 = 0;
              while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
                paVar13 = (anm_entry_t *)plVar6->data;
                if (paVar13->processed == 0) {
                  current_output = paVar13->name;
                  if (option_verbose != 0) {
                    fprintf(_stderr,"%s\n");
                  }
                  if (option_unique_filenames == 0) {
                    pcVar16 = (char *)0x0;
                  }
                  else {
                    pcVar16 = anm_make_unique_filename(paVar13->name,*argv,iVar4);
                  }
                  pcVar17 = pcVar16;
                  if (pcVar16 == (char *)0x0) {
                    pcVar17 = paVar13->name;
                  }
                  anm_extract(paVar13,pcVar17,local_88);
                  free(pcVar16);
                }
                iVar4 = iVar4 + 1;
              }
            }
            else {
              uVar14 = 2;
              if (2 < (int)uVar2) {
                uVar14 = (ulong)uVar2;
              }
              uVar22 = 1;
              do {
                iVar4 = 0;
                plVar12 = plVar6;
                while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
                  paVar13 = (anm_entry_t *)plVar12->data;
                  if (paVar13->processed == 0) {
                    pcVar16 = paVar13->name;
                    iVar3 = strcmp(argv[uVar22],pcVar16);
                    if (iVar3 == 0) {
                      current_output = pcVar16;
                      if (option_verbose != 0) {
                        fprintf(_stderr,"%s\n",pcVar16);
                      }
                      if (option_unique_filenames == 0) {
                        pcVar16 = (char *)0x0;
                      }
                      else {
                        pcVar16 = anm_make_unique_filename(paVar13->name,*argv,iVar4);
                      }
                      pcVar17 = pcVar16;
                      if (pcVar16 == (char *)0x0) {
                        pcVar17 = paVar13->name;
                      }
                      anm_extract(paVar13,pcVar17,local_88);
                      free(pcVar16);
                    }
                  }
                  iVar4 = iVar4 + 1;
                }
                fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[uVar22])
                ;
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar14);
            }
            goto LAB_0010d877;
          }
          goto LAB_0010d572;
        }
      }
      else if (iVar4 == 0x72) {
        if (local_6c == 3) {
          if (local_88 == 0x13) {
            pcVar16 = "%s: -r doesn\'t work with th19\n";
            goto LAB_0010ce23;
          }
          current_output = argv[2];
          current_input = *argv;
          pFVar5 = fopen(*argv,"rb");
          if (pFVar5 != (FILE *)0x0) {
            paVar7 = anm_read_file((FILE *)pFVar5,local_88);
            fclose(pFVar5);
            pFVar9 = fopen(*argv,"rb+");
            pFVar5 = _stderr;
            pcVar17 = current_input;
            pcVar16 = argv0;
            if (pFVar9 == (FILE *)0x0) {
              piVar10 = __errno_location();
              pcVar11 = strerror(*piVar10);
              fprintf(pFVar5,"%s: couldn\'t open %s for writing: %s\n",pcVar16,pcVar17,pcVar11);
              goto LAB_0010d0b8;
            }
            plVar6 = (list_node_t *)&paVar7->names;
            plVar20 = (list_node_t *)&paVar7->entries;
            plVar12 = plVar6;
            while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
              pvVar8 = plVar12->data;
              plVar18 = plVar20;
              plVar19 = &local_60;
              while (plVar18 = plVar18->next, plVar18 != (list_node_t *)0x0) {
                plVar1 = (list_node_t *)plVar18->data;
                if (plVar1->data == pvVar8) {
                  plVar19->next = plVar1;
                  plVar19 = (list_node_t *)&plVar1[1].data;
                }
              }
            }
            do {
              plVar6 = plVar6->next;
              if (plVar6 == (list_node_t *)0x0) goto LAB_0010d94b;
              pcVar16 = (char *)plVar6->data;
              iVar4 = strcmp(argv[1],pcVar16);
            } while (iVar4 != 0);
            do {
              plVar20 = plVar20->next;
              if (plVar20 == (list_node_t *)0x0) {
                paVar13 = (anm_entry_t *)0x0;
                break;
              }
              paVar13 = (anm_entry_t *)plVar20->data;
            } while (paVar13->name != pcVar16);
            anm_replace(paVar7,(FILE *)pFVar9,paVar13,argv[2],local_88);
            if (plVar6 == (list_node_t *)0x0) {
LAB_0010d94b:
              fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[1]);
            }
            fclose(pFVar9);
            goto LAB_0010d877;
          }
          goto LAB_0010d572;
        }
      }
      else if ((iVar4 == 0x6c) && (local_6c == 1)) {
        current_input = *argv;
        pFVar5 = fopen(*argv,"rb");
        if (pFVar5 != (FILE *)0x0) {
          paVar7 = anm_read_file((FILE *)pFVar5,local_88);
          fclose(pFVar5);
          anm_dump(_stdout,paVar7,local_88,*argv);
          goto LAB_0010d877;
        }
LAB_0010d572:
        fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
        goto LAB_0010d0b8;
      }
LAB_0010d153:
      print_usage();
      goto LAB_0010d0b8;
    }
  }
  else if ((((local_88 - 0x5f < 0x31) &&
            ((0x1000240000101U >> ((ulong)(local_88 - 0x5f) & 0x3f) & 1) != 0)) ||
           (local_88 == 0xa5)) || (local_88 == 0xb9)) goto LAB_0010d0c2;
LAB_0010d096:
  fprintf(_stderr,"%s: version %u is unsupported\n",argv0);
LAB_0010d0b8:
  exit(1);
}

Assistant:

int
main(
    int argc,
    char* argv[])
{
    g_anmmap = anmmap_new();
    atexit(free_globals);

    const char commands[] = ":l:om:"
#ifdef HAVE_LIBPNG
                            "x:X:r:c:s:"
#endif
                            "Vfuv";
    int command = -1;

    FILE* in;
    unsigned version = 0;

    anm_archive_t* anm;
#ifdef HAVE_LIBPNG
    anm_entry_t* entry;
    char* name;

    FILE* anmfp;
    FILE* symbolfp = NULL;
    int i;
#endif

    argv0 = util_shortname(argv[0]);
    int opt;
    int ind = 0;
    while(argv[util_optind]) {
        switch(opt = util_getopt(argc,argv,commands)) {
        case 'c':
            if (option_print_offsets) {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            /* fallthrough */
        case 'l':
        case 'x':
        case 'X':
        case 'r':
            if(command != -1) {
                fprintf(stderr,"%s: More than one mode specified\n",argv0);
                print_usage();
                exit(1);
            }
            command = opt;
            version = parse_version(util_optarg);
            break;
        case 'm': {
            FILE* map_file = NULL;
            map_file = fopen(util_optarg, "r");
            if (!map_file) {
                fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
                    argv0, util_optarg, strerror(errno));
            } else {
                anmmap_load(g_anmmap, map_file, util_optarg);
                fclose(map_file);
            }
            break;
        }
        case 's':
            symbolfp = fopen(util_optarg, "w");
            if (!symbolfp) {
                fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                    argv0, util_optarg, strerror(errno));
            }
            break;
        case 'f':
            option_force = 1;
            break;
        case 'u':
            if (option_unique_filenames)
                option_dont_add_offset_border = 1;
            else
                option_unique_filenames = 1;
            break;
        case 'v':
            option_verbose++;
            break;
        case 'o':
            if (command == 'c') {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            option_print_offsets = 1;
            break;
        default:
            util_getopt_default(&ind,argv,opt,print_usage);
        }
    }
    argc = ind;
    argv[argc] = NULL;

    if (command == -1) {
        print_usage();
        exit(1);
    }

    switch (version) {
    case 6:
    case 7:
    case 8:
    case 9:
    case 95:
    case 10:
    case 103:
    case 11:
    case 125:
    case 128:
    case 12:
    case 13:
    case 143:
    case 14:
    case 15:
    case 165:
    case 16:
    case 17:
    case 185:
    case 18:
    case 19:
    /* NEWHU: 19 */
        break;
    default:
        if (version == 0)
            fprintf(stderr, "%s: version must be specified\n", argv0);
        else
            fprintf(stderr, "%s: version %u is unsupported\n", argv0, version);
        exit(1);
    }

    switch (command) {
    case 'l':
        if (argc != 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);
        anm_dump(stdout, anm, version, argv[0]);

        anm_free(anm);
        exit(0);
#ifdef HAVE_LIBPNG
    case 'x':
        if (argc < 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        if (!option_unique_filenames)
            anm_build_name_lists(anm);

        if (argc == 1) {
            /* Extract all files. */
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[0], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
        } else {
            /* Extract all listed files. */
            for (i = 1; i < argc; ++i) {
                int j = 0;
                list_for_each(&anm->entries, entry) {
                    if (!entry->processed) {
                        if (strcmp(argv[i], entry->name) == 0) {
                            char *filename = 0;
                            current_output = entry->name;
                            if (option_verbose >= 1)
                                fprintf(stderr, "%s\n", entry->name);
                            if (option_unique_filenames)
                                filename = anm_make_unique_filename(entry->name, argv[0], j);
                            anm_extract(entry, filename ? filename : entry->name, version);
                            free(filename);
                            /* unfortunately we can't just skip to next argv, because of possible duplicates */
                        }
                    }
                    j++;
                }
                fprintf(stderr, "%s:%s: %s not found in archive\n",
                    argv0, current_input, argv[i]);
            }
        }

        anm_free(anm);
        exit(0);
    case 'X': {
        list_t anms;
        list_init(&anms);

        if (argc < 1) {
            print_usage();
            exit(1);
        }

        for (i = 0; i < argc; ++i) {
            current_input = argv[i];
            in = fopen(argv[i], "rb");
            if (!in) {
                fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
                exit(1);
            }
            anm = anm_read_file(in, version);
            list_append_new(&anms, anm);
            fclose(in);
        }

        anm_build_name_lists_multiple(&anms);

        i = 0;
        list_for_each(&anms, anm) {
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[i], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
            i++;
        }

        list_for_each(&anms, anm)
            anm_free(anm);
        list_free_nodes(&anms);
        exit(0);
    }
    case 'r':
        if (argc != 3) {
            print_usage();
            exit(1);
        }

        if (version == 19) {
            /* NEWHU: 19 */ /* FIXME: */
            fprintf(stderr, "%s: -r doesn't work with th19\n", argv0);
            exit(1);
        }

        current_output = argv[2];
        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        anmfp = fopen(argv[0], "rb+");
        if (!anmfp) {
            fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, current_input, strerror(errno));
            exit(1);
        }

        anm_build_name_lists(anm);
        list_for_each(&anm->names, name) {
            if (strcmp(argv[1], name) == 0) {
                anm_replace(anm, anmfp, util_entry_by_name(anm, name), argv[2], version);
                goto replace_done;
            }
        }

        fprintf(stderr, "%s:%s: %s not found in archive\n",
            argv0, current_input, argv[1]);

replace_done:

        fclose(anmfp);

#if 0
        offset = 0;
        list_for_each(&anm->entries, entry) {
            unsigned int nextoffset = entry->header->nextoffset;
            if (strcmp(argv[1], entry->name) == 0 && entry->header->hasdata) {
                if (!file_seek(anmfp,
                    offset + entry->header->thtxoffset + 4 + sizeof(thtx_header_t)))
                    exit(1);
                if (!file_write(anmfp, entry->data, entry->thtx->size))
                    exit(1);
            }
            offset += nextoffset;
        }
#endif

        anm_free(anm);
        exit(0);
    case 'c':
        if (argc != 2) {
            print_usage();
            exit(1);
        }
        current_input = argv[1];
        anm = anm_create(argv[1], symbolfp, version);

        if (symbolfp)
            fclose(symbolfp);

        if (anm == NULL)
            exit(0);

        anm_defaults(anm, version);

        /* Allocate enough space for the THTX data. */
        if (!option_unique_filenames)
            anm_build_name_lists(anm);
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && !entry->data) {
                /* XXX: There are a few entries with a thtx.size greater than
                 *      w*h*Bpp.  The extra data appears to be all zeroes. */
                entry->data = calloc(1, entry->thtx->size);
            }
        }
        list_for_each(&anm->entries, entry) {
            if (!entry->processed)
                anm_replace(anm, NULL, entry, entry->filename ? entry->filename : entry->name, version);
        }

        current_output = argv[0];
        anm_write(anm, argv[0], version);

        anm_free(anm);
        exit(0);
#endif
    default:
        print_usage();
        exit(1);
    }
}